

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.h
# Opt level: O2

string * __thiscall
CLIntercept::getShortKernelNameWithHash_abi_cxx11_
          (string *__return_storage_ptr__,CLIntercept *this,cl_kernel kernel)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  mapped_type *pmVar4;
  char *__format;
  char hashString [256];
  cl_kernel local_120;
  char local_118 [256];
  
  local_120 = kernel;
  getShortKernelName_abi_cxx11_(__return_storage_ptr__,this,kernel);
  if ((this->m_Config).KernelNameHashTracking == true) {
    pmVar4 = std::
             map<_cl_kernel_*,_CLIntercept::SKernelInfo,_std::less<_cl_kernel_*>,_std::allocator<std::pair<_cl_kernel_*const,_CLIntercept::SKernelInfo>_>_>
             ::operator[](&this->m_KernelInfoMap,&local_120);
    memset(local_118,0,0x100);
    if ((this->m_Config).OmitProgramNumber == true) {
      uVar1 = pmVar4->CompileCount;
      uVar2 = (uint)pmVar4->ProgramHash;
      uVar3 = (uint)pmVar4->OptionsHash;
      __format = "$%08X_%04u_%08X";
    }
    else {
      uVar2 = pmVar4->ProgramNumber;
      uVar3 = pmVar4->CompileCount;
      uVar1 = (uint)pmVar4->ProgramHash;
      __format = "$%04u_%08X_%04u_%08X";
    }
    snprintf(local_118,0x100,__format,(ulong)uVar2,(ulong)uVar1,(ulong)uVar3);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string CLIntercept::getShortKernelNameWithHash(
    const cl_kernel kernel )
{
    std::string name = getShortKernelName( kernel );

    if( config().KernelNameHashTracking )
    {
        const SKernelInfo& kernelInfo = m_KernelInfoMap[ kernel ];

        char    hashString[256] = "";
        if( config().OmitProgramNumber )
        {
            CLI_SPRINTF( hashString, 256, "$%08X_%04u_%08X",
                (unsigned int)kernelInfo.ProgramHash,
                kernelInfo.CompileCount,
                (unsigned int)kernelInfo.OptionsHash );
        }
        else
        {
            CLI_SPRINTF( hashString, 256, "$%04u_%08X_%04u_%08X",
                kernelInfo.ProgramNumber,
                (unsigned int)kernelInfo.ProgramHash,
                kernelInfo.CompileCount,
                (unsigned int)kernelInfo.OptionsHash );
        }

        name += hashString;
    }

    return name;
}